

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CopyingAndMergingEmptyPages.cpp
# Opt level: O3

EStatusCode MergeEmptyPageToForm(char **argv,string *inEmptyFileName)

{
  pointer pcVar1;
  EStatusCode EVar2;
  LogConfiguration *inLogConfiguration;
  EncryptionOptions *pEVar3;
  PDFPage *this;
  PDFParsingOptions *inOptions;
  PDFDocumentCopyingContext *this_00;
  PDFFormXObject *this_01;
  XObjectContentContext *this_02;
  ObjectIDType inFormXObjectID;
  PageContentContext *inPageContext;
  ResourcesDictionary *this_03;
  string formName;
  PDFWriter pdfWriter;
  undefined1 local_fd8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_fb8;
  _Alloc_hider local_fa0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f90;
  string local_f78;
  string *local_f58;
  string local_f50;
  undefined1 local_f30 [8];
  _Alloc_hider local_f28;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f18;
  longlong local_f08;
  _Alloc_hider local_f00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_ef0;
  PDFWriter local_ee0;
  
  local_f58 = inEmptyFileName;
  PDFWriter::PDFWriter(&local_ee0);
  local_f78._M_dataplus._M_p = (pointer)&local_f78.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_f78,"MergeEmptyPageToForm.pdf","");
  BuildRelativeOutputPath(&local_f50,(char **)argv[2],&local_f78);
  inLogConfiguration = LogConfiguration::DefaultLogConfiguration();
  pEVar3 = EncryptionOptions::DefaultEncryptionOptions();
  local_f30[0] = pEVar3->ShouldEncrypt;
  pcVar1 = (pEVar3->UserPassword)._M_dataplus._M_p;
  local_f28._M_p = (pointer)&local_f18;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f28,pcVar1,pcVar1 + (pEVar3->UserPassword)._M_string_length);
  local_f08 = pEVar3->UserProtectionOptionsFlag;
  pcVar1 = (pEVar3->OwnerPassword)._M_dataplus._M_p;
  local_f00._M_p = (pointer)&local_ef0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f00,pcVar1,pcVar1 + (pEVar3->OwnerPassword)._M_string_length);
  PDFCreationSettings::PDFCreationSettings
            ((PDFCreationSettings *)local_fd8,true,true,(EncryptionOptions *)local_f30,false);
  EVar2 = PDFWriter::StartPDF(&local_ee0,&local_f50,ePDFVersion13,inLogConfiguration,
                              (PDFCreationSettings *)local_fd8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_fa0._M_p != &local_f90) {
    operator_delete(local_fa0._M_p,local_f90._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_fd8._16_8_ != &local_fb8) {
    operator_delete((void *)local_fd8._16_8_,local_fb8._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f00._M_p != &local_ef0) {
    operator_delete(local_f00._M_p,local_ef0._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f28._M_p != &local_f18) {
    operator_delete(local_f28._M_p,local_f18._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f50._M_dataplus._M_p != &local_f50.field_2) {
    operator_delete(local_f50._M_dataplus._M_p,local_f50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f78._M_dataplus._M_p != &local_f78.field_2) {
    operator_delete(local_f78._M_dataplus._M_p,local_f78.field_2._M_allocated_capacity + 1);
  }
  if (EVar2 == eSuccess) {
    this = (PDFPage *)operator_new(0x2b8);
    PDFPage::PDFPage(this);
    PDFRectangle::PDFRectangle((PDFRectangle *)local_fd8,0.0,0.0,595.0,842.0);
    PDFPage::SetMediaBox(this,(PDFRectangle *)local_fd8);
    PDFRectangle::~PDFRectangle((PDFRectangle *)local_fd8);
    BuildRelativeOutputPath((string *)local_fd8,(char **)argv[2],local_f58);
    inOptions = PDFParsingOptions::DefaultPDFParsingOptions();
    this_00 = PDFWriter::CreatePDFCopyingContext(&local_ee0,(string *)local_fd8,inOptions);
    if ((undefined1 *)local_fd8._0_8_ != local_fd8 + 0x10) {
      operator_delete((void *)local_fd8._0_8_,(ulong)(local_fd8._16_8_ + 1));
    }
    PDFRectangle::PDFRectangle((PDFRectangle *)local_fd8,0.0,0.0,297.5,842.0);
    this_01 = PDFWriter::StartFormXObject(&local_ee0,(PDFRectangle *)local_fd8,(double *)0x0);
    PDFRectangle::~PDFRectangle((PDFRectangle *)local_fd8);
    if (this_01 == (PDFFormXObject *)0x0) {
      EVar2 = eFailure;
    }
    else {
      this_02 = PDFFormXObject::GetContentContext(this_01);
      AbstractContentContext::q(&this_02->super_AbstractContentContext);
      AbstractContentContext::cm(&this_02->super_AbstractContentContext,0.5,0.0,0.0,0.5,0.0,421.0);
      EVar2 = PDFDocumentCopyingContext::MergePDFPageToFormXObject(this_00,this_01,0);
      if (EVar2 == eSuccess) {
        AbstractContentContext::Q(&this_02->super_AbstractContentContext);
        inFormXObjectID = PDFFormXObject::GetObjectID(this_01);
        EVar2 = PDFWriter::EndFormXObjectAndRelease(&local_ee0,this_01);
        if (EVar2 == eSuccess) {
          inPageContext = PDFWriter::StartPageContentContext(&local_ee0,this);
          this_03 = PDFPage::GetResourcesDictionary(this);
          ResourcesDictionary::AddFormXObjectMapping_abi_cxx11_
                    ((string *)local_fd8,this_03,inFormXObjectID);
          AbstractContentContext::q(&inPageContext->super_AbstractContentContext);
          AbstractContentContext::Do
                    (&inPageContext->super_AbstractContentContext,(string *)local_fd8);
          AbstractContentContext::cm
                    (&inPageContext->super_AbstractContentContext,1.0,0.0,0.0,1.0,297.5,0.0);
          AbstractContentContext::Do
                    (&inPageContext->super_AbstractContentContext,(string *)local_fd8);
          AbstractContentContext::Q(&inPageContext->super_AbstractContentContext);
          EVar2 = PDFWriter::EndPageContentContext(&local_ee0,inPageContext);
          if (EVar2 == eSuccess) {
            EVar2 = PDFWriter::WritePageAndRelease(&local_ee0,this);
            if (EVar2 == eSuccess) {
              EVar2 = PDFWriter::EndPDF(&local_ee0);
            }
          }
          if ((undefined1 *)local_fd8._0_8_ != local_fd8 + 0x10) {
            operator_delete((void *)local_fd8._0_8_,(ulong)(local_fd8._16_8_ + 1));
          }
        }
      }
    }
    if (this_00 != (PDFDocumentCopyingContext *)0x0) {
      PDFDocumentCopyingContext::~PDFDocumentCopyingContext(this_00);
      goto LAB_00131a1f;
    }
  }
  this_00 = (PDFDocumentCopyingContext *)0x0;
LAB_00131a1f:
  operator_delete(this_00,0xd0);
  PDFWriter::~PDFWriter(&local_ee0);
  return EVar2;
}

Assistant:

static EStatusCode MergeEmptyPageToForm(char* argv[], const string& inEmptyFileName)
{
	PDFWriter pdfWriter;
	EStatusCode status;
    PDFDocumentCopyingContext* copyingContext = NULL;
    
	do
	{
		status = pdfWriter.StartPDF(BuildRelativeOutputPath(argv,"MergeEmptyPageToForm.pdf"),
                                    ePDFVersion13);
		if(status != PDFHummus::eSuccess)
			break;
        
        
        // in this test we will merge 2 pages into a PDF form, and place it twice, forming a 2X2 design. amazing.
        
		PDFPage* page = new PDFPage();
		page->SetMediaBox(PDFRectangle(0,0,595,842));
        
        
        copyingContext = pdfWriter.CreatePDFCopyingContext(BuildRelativeOutputPath(argv,inEmptyFileName));
        if(status != PDFHummus::eSuccess)
            break;
        
        // create form for two pages.
        PDFFormXObject* newFormXObject = pdfWriter.StartFormXObject(PDFRectangle(0,0,297.5,842));
		if(!newFormXObject)
		{
			status = PDFHummus::eFailure;
			break;
		}
        
		XObjectContentContext* xobjectContentContext = newFormXObject->GetContentContext();
        
        xobjectContentContext->q();
        xobjectContentContext->cm(0.5,0,0,0.5,0,421);
        status = copyingContext->MergePDFPageToFormXObject(newFormXObject,0);
        if(status != eSuccess)
            break;
        xobjectContentContext->Q();
        
        ObjectIDType formID = newFormXObject->GetObjectID();
        status = pdfWriter.EndFormXObjectAndRelease(newFormXObject);
        if(status != eSuccess)
            break;
        
        // now place it in the page
        PageContentContext* pageContentContext = pdfWriter.StartPageContentContext(page);
        
        
        string formName = page->GetResourcesDictionary().AddFormXObjectMapping(formID);
        
        pageContentContext->q();
        pageContentContext->Do(formName);
        pageContentContext->cm(1,0,0,1,297.5,0);
        pageContentContext->Do(formName);
        pageContentContext->Q();
        
        status = pdfWriter.EndPageContentContext(pageContentContext);
        if(status != eSuccess)
            break;
        
		status = pdfWriter.WritePageAndRelease(page);
		if(status != PDFHummus::eSuccess)
			break;
        
		status = pdfWriter.EndPDF();
		if(status != PDFHummus::eSuccess)
			break;
	}while(false);
    
    delete copyingContext;
	
	return status;
}